

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

gen_digits_params fmt::v5::internal::process_specs(core_format_specs *specs,int exp,buffer *buf)

{
  byte bVar1;
  char_counter cVar2;
  gen_digits_params gVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  gen_digits_params params;
  char_counter counter;
  gen_digits_params local_20;
  char_counter local_18;
  
  local_20.num_digits = 0;
  local_20.fixed = false;
  local_20.upper = false;
  local_20.trailing_zeros = false;
  local_20._7_1_ = 0;
  gVar3 = local_20;
  local_20.fixed = false;
  local_20.upper = false;
  local_20.trailing_zeros = false;
  local_20._7_1_ = 0;
  uVar4 = local_20._4_4_;
  local_20.fixed = false;
  local_20.upper = false;
  local_20.trailing_zeros = false;
  local_20._7_1_ = 0;
  uVar5 = 6;
  if (-1 < specs->precision) {
    uVar5 = specs->precision;
  }
  bVar1 = specs->type;
  uVar6 = uVar5;
  if (bVar1 < 0x47) {
    if (bVar1 != 0) {
      if (bVar1 != 0x45) {
        if (bVar1 != 0x46) goto LAB_0020411f;
        local_20.num_digits = 0;
        local_20.fixed = false;
        local_20.upper = true;
        local_20.trailing_zeros = false;
        local_20._7_1_ = 0;
        gVar3 = local_20;
        goto LAB_002040be;
      }
      local_20.fixed = false;
      local_20.upper = true;
      local_20.trailing_zeros = false;
      local_20._7_1_ = 0;
      uVar4 = local_20._4_4_;
LAB_0020411d:
      local_20._4_4_ = uVar4;
      uVar6 = uVar5 + 1;
      goto LAB_0020411f;
    }
  }
  else if (bVar1 < 0x66) {
    if (bVar1 != 0x47) {
      if (bVar1 != 0x65) goto LAB_0020411f;
      goto LAB_0020411d;
    }
    local_20.num_digits = 0;
    local_20.fixed = false;
    local_20.upper = true;
    local_20.trailing_zeros = false;
    local_20._7_1_ = 0;
    gVar3 = local_20;
  }
  else {
    if (bVar1 == 0x66) {
LAB_002040be:
      local_20 = gVar3;
      local_20.num_digits = 0;
      local_20.fixed = true;
      local_20.trailing_zeros = true;
      local_20._7_1_ = 0;
      local_20._4_3_ = local_20._4_3_;
      if (0 < (int)(uVar5 + exp)) {
        uVar6 = uVar5 + exp;
      }
      goto LAB_0020411f;
    }
    if (bVar1 != 0x67) goto LAB_0020411f;
  }
  local_20 = gVar3;
  bVar7 = specs->flags >> 3;
  local_20 = (gen_digits_params)((ulong)CONCAT16(bVar7,local_20._0_6_) & 0xff01ffffffffffff);
  if (exp <= (int)uVar5 && -5 < exp) {
    local_20.num_digits = 0;
    local_20.fixed = true;
    if (bVar1 == 0) {
      uVar6 = exp + 1;
      if ((bVar7 & 1) == 0) {
        uVar6 = uVar5;
      }
      if (exp < 0) {
        uVar6 = uVar5;
      }
    }
  }
LAB_0020411f:
  local_20.num_digits = uVar6;
  local_18.size = (ptrdiff_t)uVar6;
  grisu2_prettify<fmt::v5::internal::char_counter&>(&local_20,uVar6,exp - uVar6,&local_18);
  cVar2.size = local_18.size;
  if (buf->capacity_ < (ulong)local_18.size) {
    (**buf->_vptr_basic_buffer)(buf,local_18.size);
  }
  buf->size_ = cVar2.size;
  return local_20;
}

Assistant:

FMT_FUNC gen_digits_params process_specs(const core_format_specs &specs,
                                         int exp, buffer &buf) {
  auto params = gen_digits_params();
  int num_digits = specs.precision >= 0 ? specs.precision : 6;
  switch (specs.type) {
  case 'G':
    params.upper = true;
    FMT_FALLTHROUGH
  case '\0': case 'g':
    params.trailing_zeros = (specs.flags & HASH_FLAG) != 0;
    if (-4 <= exp && exp < num_digits + 1) {
      params.fixed = true;
      if (!specs.type && params.trailing_zeros && exp >= 0)
        num_digits = exp + 1;
    }
    break;
  case 'F':
    params.upper = true;
    FMT_FALLTHROUGH
  case 'f': {
    params.fixed = true;
    params.trailing_zeros = true;
    int adjusted_min_digits = num_digits + exp;
    if (adjusted_min_digits > 0)
      num_digits = adjusted_min_digits;
    break;
  }
  case 'E':
    params.upper = true;
    FMT_FALLTHROUGH
  case 'e':
    ++num_digits;
    break;
  }
  params.num_digits = num_digits;
  char_counter counter{num_digits};
  grisu2_prettify(params, params.num_digits, exp - num_digits, counter);
  buf.resize(to_unsigned(counter.size));
  return params;
}